

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_1::checkRequiredGLRobustnessExtension(EGLint *attribList,Functions *gl)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  NotSupportedError *this;
  long *plVar4;
  size_type *psVar5;
  int iVar6;
  ApiType apiType;
  uint uVar7;
  string local_88;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar7 = 1;
  iVar6 = 0;
  do {
    iVar2 = *attribList;
    do {
      while (0x30be < iVar2) {
        if (iVar2 == 0x30bf) goto LAB_00e5ad62;
        if (iVar2 == 0x30fb) {
          iVar6 = attribList[1];
          goto LAB_00e5ad62;
        }
        if (iVar2 == 0x3138) goto LAB_00e5ad62;
      }
      if (iVar2 == 0x3038) {
        paVar1 = &local_88.field_2;
        local_88._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"GL_KHR_robustness","");
        apiType.m_bits = iVar6 << 4 | uVar7;
        bVar3 = glu::hasExtension(gl,apiType,&local_88);
        if (bVar3) {
          bVar3 = false;
        }
        else {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"GL_EXT_robustness","");
          bVar3 = glu::hasExtension(gl,apiType,&local_68);
          bVar3 = !bVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          return;
        }
        this = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"GL_KHR_robustness and GL_EXT_robustness","");
        plVar4 = (long *)std::__cxx11::string::append((char *)local_48);
        local_88._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_88._M_dataplus._M_p == psVar5) {
          local_88.field_2._M_allocated_capacity = *psVar5;
          local_88.field_2._8_8_ = plVar4[3];
          local_88._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_88.field_2._M_allocated_capacity = *psVar5;
        }
        local_88._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        tcu::NotSupportedError::NotSupportedError
                  (this,local_88._M_dataplus._M_p,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                   ,0x101);
        __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    } while (iVar2 != 0x3098);
    uVar7 = attribList[1];
LAB_00e5ad62:
    attribList = attribList + 2;
  } while( true );
}

Assistant:

void checkRequiredGLRobustnessExtension (const EGLint* attribList, const glw::Functions& gl)
{
	EGLint				majorVersion			= 1;
	EGLint				minorVersion			= 0;
	EGLint				robustAccessExt			= 0;
	parseAttributeValues(attribList, majorVersion, minorVersion, robustAccessExt);

	glu::ApiType		apiType					= glu::ApiType::es(majorVersion, minorVersion);

	if (!glu::hasExtension(gl, apiType, "GL_KHR_robustness") && !glu::hasExtension(gl, apiType, "GL_EXT_robustness"))
		TCU_THROW(NotSupportedError, (string("GL_KHR_robustness and GL_EXT_robustness") + " not supported").c_str());
}